

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem.cpp
# Opt level: O2

RealType __thiscall
QuantLib::Problem::DotProduct
          (Problem *this,DynamicVector<double,_std::allocator<double>_> *v1,
          DynamicVector<double,_std::allocator<double>_> *v2)

{
  double dVar1;
  
  dVar1 = OpenMD::dot<double>(v1,v2);
  return dVar1;
}

Assistant:

RealType Problem::DotProduct(DynamicVector<RealType>& v1,
                               DynamicVector<RealType>& v2) {
    RealType dp = dot(v1, v2);
    return dp;
  }